

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderUtil.cpp
# Opt level: O0

DataType glu::getDataTypeFromGLType(deUint32 glType)

{
  undefined4 local_c;
  deUint32 glType_local;
  
  if (glType == 0x1404) {
    local_c = TYPE_INT;
  }
  else if (glType == 0x1405) {
    local_c = TYPE_UINT;
  }
  else if (glType == 0x1406) {
    local_c = TYPE_FLOAT;
  }
  else if (glType == 0x140a) {
    local_c = TYPE_DOUBLE;
  }
  else if (glType == 0x8b50) {
    local_c = TYPE_FLOAT_VEC2;
  }
  else if (glType == 0x8b51) {
    local_c = TYPE_FLOAT_VEC3;
  }
  else if (glType == 0x8b52) {
    local_c = TYPE_FLOAT_VEC4;
  }
  else if (glType == 0x8b53) {
    local_c = TYPE_INT_VEC2;
  }
  else if (glType == 0x8b54) {
    local_c = TYPE_INT_VEC3;
  }
  else if (glType == 0x8b55) {
    local_c = TYPE_INT_VEC4;
  }
  else if (glType == 0x8b56) {
    local_c = TYPE_BOOL;
  }
  else if (glType == 0x8b57) {
    local_c = TYPE_BOOL_VEC2;
  }
  else if (glType == 0x8b58) {
    local_c = TYPE_BOOL_VEC3;
  }
  else if (glType == 0x8b59) {
    local_c = TYPE_BOOL_VEC4;
  }
  else if (glType == 0x8b5a) {
    local_c = TYPE_FLOAT_MAT2;
  }
  else if (glType == 0x8b5b) {
    local_c = TYPE_FLOAT_MAT3;
  }
  else if (glType == 0x8b5c) {
    local_c = TYPE_FLOAT_MAT4;
  }
  else if (glType == 0x8b5d) {
    local_c = TYPE_SAMPLER_1D;
  }
  else if (glType == 0x8b5e) {
    local_c = TYPE_SAMPLER_2D;
  }
  else if (glType == 0x8b5f) {
    local_c = TYPE_SAMPLER_3D;
  }
  else if (glType == 0x8b60) {
    local_c = TYPE_SAMPLER_CUBE;
  }
  else if (glType == 0x8b61) {
    local_c = TYPE_SAMPLER_1D_SHADOW;
  }
  else if (glType == 0x8b62) {
    local_c = TYPE_SAMPLER_2D_SHADOW;
  }
  else if (glType == 0x8b65) {
    local_c = TYPE_FLOAT_MAT2X3;
  }
  else if (glType == 0x8b66) {
    local_c = TYPE_FLOAT_MAT2X4;
  }
  else if (glType == 0x8b67) {
    local_c = TYPE_FLOAT_MAT3X2;
  }
  else if (glType == 0x8b68) {
    local_c = TYPE_FLOAT_MAT3X4;
  }
  else if (glType == 0x8b69) {
    local_c = TYPE_FLOAT_MAT4X2;
  }
  else if (glType == 0x8b6a) {
    local_c = TYPE_FLOAT_MAT4X3;
  }
  else if (glType == 0x8dc0) {
    local_c = TYPE_SAMPLER_1D_ARRAY;
  }
  else if (glType == 0x8dc1) {
    local_c = TYPE_SAMPLER_2D_ARRAY;
  }
  else if (glType == 0x8dc2) {
    local_c = TYPE_SAMPLER_BUFFER;
  }
  else if (glType == 0x8dc3) {
    local_c = TYPE_SAMPLER_1D_ARRAY_SHADOW;
  }
  else if (glType == 0x8dc4) {
    local_c = TYPE_SAMPLER_2D_ARRAY_SHADOW;
  }
  else if (glType == 0x8dc5) {
    local_c = TYPE_SAMPLER_CUBE_SHADOW;
  }
  else if (glType == 0x8dc6) {
    local_c = TYPE_UINT_VEC2;
  }
  else if (glType == 0x8dc7) {
    local_c = TYPE_UINT_VEC3;
  }
  else if (glType == 0x8dc8) {
    local_c = TYPE_UINT_VEC4;
  }
  else if (glType == 0x8dc9) {
    local_c = TYPE_INT_SAMPLER_1D;
  }
  else if (glType == 0x8dca) {
    local_c = TYPE_INT_SAMPLER_2D;
  }
  else if (glType == 0x8dcb) {
    local_c = TYPE_INT_SAMPLER_3D;
  }
  else if (glType == 0x8dcc) {
    local_c = TYPE_INT_SAMPLER_CUBE;
  }
  else if (glType == 0x8dce) {
    local_c = TYPE_INT_SAMPLER_1D_ARRAY;
  }
  else if (glType == 0x8dcf) {
    local_c = TYPE_INT_SAMPLER_2D_ARRAY;
  }
  else if (glType == 0x8dd0) {
    local_c = TYPE_INT_SAMPLER_BUFFER;
  }
  else if (glType == 0x8dd1) {
    local_c = TYPE_UINT_SAMPLER_1D;
  }
  else if (glType == 0x8dd2) {
    local_c = TYPE_UINT_SAMPLER_2D;
  }
  else if (glType == 0x8dd3) {
    local_c = TYPE_UINT_SAMPLER_3D;
  }
  else if (glType == 0x8dd4) {
    local_c = TYPE_UINT_SAMPLER_CUBE;
  }
  else if (glType == 0x8dd6) {
    local_c = TYPE_UINT_SAMPLER_1D_ARRAY;
  }
  else if (glType == 0x8dd7) {
    local_c = TYPE_UINT_SAMPLER_2D_ARRAY;
  }
  else if (glType == 0x8dd8) {
    local_c = TYPE_UINT_SAMPLER_BUFFER;
  }
  else if (glType == 0x8f46) {
    local_c = TYPE_DOUBLE_MAT2;
  }
  else if (glType == 0x8f47) {
    local_c = TYPE_DOUBLE_MAT3;
  }
  else if (glType == 0x8f48) {
    local_c = TYPE_DOUBLE_MAT4;
  }
  else if (glType == 0x8f49) {
    local_c = TYPE_DOUBLE_MAT2X3;
  }
  else if (glType == 0x8f4a) {
    local_c = TYPE_DOUBLE_MAT2X4;
  }
  else if (glType == 0x8f4b) {
    local_c = TYPE_DOUBLE_MAT3X2;
  }
  else if (glType == 0x8f4c) {
    local_c = TYPE_DOUBLE_MAT3X4;
  }
  else if (glType == 0x8f4d) {
    local_c = TYPE_DOUBLE_MAT4X2;
  }
  else if (glType == 0x8f4e) {
    local_c = TYPE_DOUBLE_MAT4X3;
  }
  else if (glType == 0x8ffc) {
    local_c = TYPE_DOUBLE_VEC2;
  }
  else if (glType == 0x8ffd) {
    local_c = TYPE_DOUBLE_VEC3;
  }
  else if (glType == 0x8ffe) {
    local_c = TYPE_DOUBLE_VEC4;
  }
  else if (glType == 0x900c) {
    local_c = TYPE_SAMPLER_CUBE_ARRAY;
  }
  else if (glType == 0x900d) {
    local_c = TYPE_SAMPLER_CUBE_ARRAY_SHADOW;
  }
  else if (glType == 0x900e) {
    local_c = TYPE_INT_SAMPLER_CUBE_ARRAY;
  }
  else if (glType == 0x900f) {
    local_c = TYPE_UINT_SAMPLER_CUBE_ARRAY;
  }
  else if (glType == 0x904d) {
    local_c = TYPE_IMAGE_2D;
  }
  else if (glType == 0x904e) {
    local_c = TYPE_IMAGE_3D;
  }
  else if (glType == 0x9050) {
    local_c = TYPE_IMAGE_CUBE;
  }
  else if (glType == 0x9051) {
    local_c = TYPE_IMAGE_BUFFER;
  }
  else if (glType == 0x9053) {
    local_c = TYPE_IMAGE_2D_ARRAY;
  }
  else if (glType == 0x9058) {
    local_c = TYPE_INT_IMAGE_2D;
  }
  else if (glType == 0x9059) {
    local_c = TYPE_INT_IMAGE_3D;
  }
  else if (glType == 0x905b) {
    local_c = TYPE_INT_IMAGE_CUBE;
  }
  else if (glType == 0x905c) {
    local_c = TYPE_INT_IMAGE_BUFFER;
  }
  else if (glType == 0x905e) {
    local_c = TYPE_INT_IMAGE_2D_ARRAY;
  }
  else if (glType == 0x9063) {
    local_c = TYPE_UINT_IMAGE_2D;
  }
  else if (glType == 0x9064) {
    local_c = TYPE_UINT_IMAGE_3D;
  }
  else if (glType == 0x9066) {
    local_c = TYPE_UINT_IMAGE_CUBE;
  }
  else if (glType == 0x9067) {
    local_c = TYPE_UINT_IMAGE_BUFFER;
  }
  else if (glType == 0x9069) {
    local_c = TYPE_UINT_IMAGE_2D_ARRAY;
  }
  else if (glType == 0x9108) {
    local_c = TYPE_SAMPLER_2D_MULTISAMPLE;
  }
  else if (glType == 0x9109) {
    local_c = TYPE_INT_SAMPLER_2D_MULTISAMPLE;
  }
  else if (glType == 0x910a) {
    local_c = TYPE_UINT_SAMPLER_2D_MULTISAMPLE;
  }
  else if (glType == 0x910b) {
    local_c = TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY;
  }
  else if (glType == 0x910c) {
    local_c = TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY;
  }
  else if (glType == 0x910d) {
    local_c = TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY;
  }
  else if (glType == 0x92db) {
    local_c = TYPE_UINT_ATOMIC_COUNTER;
  }
  else {
    local_c = TYPE_LAST;
  }
  return local_c;
}

Assistant:

DataType getDataTypeFromGLType (deUint32 glType)
{
	switch (glType)
	{
		case GL_FLOAT:										return TYPE_FLOAT;
		case GL_FLOAT_VEC2:									return TYPE_FLOAT_VEC2;
		case GL_FLOAT_VEC3:									return TYPE_FLOAT_VEC3;
		case GL_FLOAT_VEC4:									return TYPE_FLOAT_VEC4;

		case GL_FLOAT_MAT2:									return TYPE_FLOAT_MAT2;
		case GL_FLOAT_MAT2x3:								return TYPE_FLOAT_MAT2X3;
		case GL_FLOAT_MAT2x4:								return TYPE_FLOAT_MAT2X4;

		case GL_FLOAT_MAT3x2:								return TYPE_FLOAT_MAT3X2;
		case GL_FLOAT_MAT3:									return TYPE_FLOAT_MAT3;
		case GL_FLOAT_MAT3x4:								return TYPE_FLOAT_MAT3X4;

		case GL_FLOAT_MAT4x2:								return TYPE_FLOAT_MAT4X2;
		case GL_FLOAT_MAT4x3:								return TYPE_FLOAT_MAT4X3;
		case GL_FLOAT_MAT4:									return TYPE_FLOAT_MAT4;

		case GL_DOUBLE:										return TYPE_DOUBLE;
		case GL_DOUBLE_VEC2:								return TYPE_DOUBLE_VEC2;
		case GL_DOUBLE_VEC3:								return TYPE_DOUBLE_VEC3;
		case GL_DOUBLE_VEC4:								return TYPE_DOUBLE_VEC4;

		case GL_DOUBLE_MAT2:								return TYPE_DOUBLE_MAT2;
		case GL_DOUBLE_MAT2x3:								return TYPE_DOUBLE_MAT2X3;
		case GL_DOUBLE_MAT2x4:								return TYPE_DOUBLE_MAT2X4;

		case GL_DOUBLE_MAT3x2:								return TYPE_DOUBLE_MAT3X2;
		case GL_DOUBLE_MAT3:								return TYPE_DOUBLE_MAT3;
		case GL_DOUBLE_MAT3x4:								return TYPE_DOUBLE_MAT3X4;

		case GL_DOUBLE_MAT4x2:								return TYPE_DOUBLE_MAT4X2;
		case GL_DOUBLE_MAT4x3:								return TYPE_DOUBLE_MAT4X3;
		case GL_DOUBLE_MAT4:								return TYPE_DOUBLE_MAT4;

		case GL_INT:										return TYPE_INT;
		case GL_INT_VEC2:									return TYPE_INT_VEC2;
		case GL_INT_VEC3:									return TYPE_INT_VEC3;
		case GL_INT_VEC4:									return TYPE_INT_VEC4;

		case GL_UNSIGNED_INT:								return TYPE_UINT;
		case GL_UNSIGNED_INT_VEC2:							return TYPE_UINT_VEC2;
		case GL_UNSIGNED_INT_VEC3:							return TYPE_UINT_VEC3;
		case GL_UNSIGNED_INT_VEC4:							return TYPE_UINT_VEC4;

		case GL_BOOL:										return TYPE_BOOL;
		case GL_BOOL_VEC2:									return TYPE_BOOL_VEC2;
		case GL_BOOL_VEC3:									return TYPE_BOOL_VEC3;
		case GL_BOOL_VEC4:									return TYPE_BOOL_VEC4;

		case GL_SAMPLER_1D:									return TYPE_SAMPLER_1D;
		case GL_SAMPLER_2D:									return TYPE_SAMPLER_2D;
		case GL_SAMPLER_CUBE:								return TYPE_SAMPLER_CUBE;
		case GL_SAMPLER_1D_ARRAY:							return TYPE_SAMPLER_1D_ARRAY;
		case GL_SAMPLER_2D_ARRAY:							return TYPE_SAMPLER_2D_ARRAY;
		case GL_SAMPLER_3D:									return TYPE_SAMPLER_3D;
		case GL_SAMPLER_CUBE_MAP_ARRAY:						return TYPE_SAMPLER_CUBE_ARRAY;

		case GL_SAMPLER_1D_SHADOW:							return TYPE_SAMPLER_1D_SHADOW;
		case GL_SAMPLER_2D_SHADOW:							return TYPE_SAMPLER_2D_SHADOW;
		case GL_SAMPLER_CUBE_SHADOW:						return TYPE_SAMPLER_CUBE_SHADOW;
		case GL_SAMPLER_1D_ARRAY_SHADOW:					return TYPE_SAMPLER_1D_ARRAY_SHADOW;
		case GL_SAMPLER_2D_ARRAY_SHADOW:					return TYPE_SAMPLER_2D_ARRAY_SHADOW;
		case GL_SAMPLER_CUBE_MAP_ARRAY_SHADOW:				return TYPE_SAMPLER_CUBE_ARRAY_SHADOW;

		case GL_INT_SAMPLER_1D:								return TYPE_INT_SAMPLER_1D;
		case GL_INT_SAMPLER_2D:								return TYPE_INT_SAMPLER_2D;
		case GL_INT_SAMPLER_CUBE:							return TYPE_INT_SAMPLER_CUBE;
		case GL_INT_SAMPLER_1D_ARRAY:						return TYPE_INT_SAMPLER_1D_ARRAY;
		case GL_INT_SAMPLER_2D_ARRAY:						return TYPE_INT_SAMPLER_2D_ARRAY;
		case GL_INT_SAMPLER_3D:								return TYPE_INT_SAMPLER_3D;
		case GL_INT_SAMPLER_CUBE_MAP_ARRAY:					return TYPE_INT_SAMPLER_CUBE_ARRAY;

		case GL_UNSIGNED_INT_SAMPLER_1D:					return TYPE_UINT_SAMPLER_1D;
		case GL_UNSIGNED_INT_SAMPLER_2D:					return TYPE_UINT_SAMPLER_2D;
		case GL_UNSIGNED_INT_SAMPLER_CUBE:					return TYPE_UINT_SAMPLER_CUBE;
		case GL_UNSIGNED_INT_SAMPLER_1D_ARRAY:				return TYPE_UINT_SAMPLER_1D_ARRAY;
		case GL_UNSIGNED_INT_SAMPLER_2D_ARRAY:				return TYPE_UINT_SAMPLER_2D_ARRAY;
		case GL_UNSIGNED_INT_SAMPLER_3D:					return TYPE_UINT_SAMPLER_3D;
		case GL_UNSIGNED_INT_SAMPLER_CUBE_MAP_ARRAY:		return TYPE_UINT_SAMPLER_CUBE_ARRAY;

		case GL_SAMPLER_2D_MULTISAMPLE:						return TYPE_SAMPLER_2D_MULTISAMPLE;
		case GL_INT_SAMPLER_2D_MULTISAMPLE:					return TYPE_INT_SAMPLER_2D_MULTISAMPLE;
		case GL_UNSIGNED_INT_SAMPLER_2D_MULTISAMPLE:		return TYPE_UINT_SAMPLER_2D_MULTISAMPLE;

		case GL_IMAGE_2D:									return TYPE_IMAGE_2D;
		case GL_IMAGE_CUBE:									return TYPE_IMAGE_CUBE;
		case GL_IMAGE_2D_ARRAY:								return TYPE_IMAGE_2D_ARRAY;
		case GL_IMAGE_3D:									return TYPE_IMAGE_3D;
		case GL_INT_IMAGE_2D:								return TYPE_INT_IMAGE_2D;
		case GL_INT_IMAGE_CUBE:								return TYPE_INT_IMAGE_CUBE;
		case GL_INT_IMAGE_2D_ARRAY:							return TYPE_INT_IMAGE_2D_ARRAY;
		case GL_INT_IMAGE_3D:								return TYPE_INT_IMAGE_3D;
		case GL_UNSIGNED_INT_IMAGE_2D:						return TYPE_UINT_IMAGE_2D;
		case GL_UNSIGNED_INT_IMAGE_CUBE:					return TYPE_UINT_IMAGE_CUBE;
		case GL_UNSIGNED_INT_IMAGE_2D_ARRAY:				return TYPE_UINT_IMAGE_2D_ARRAY;
		case GL_UNSIGNED_INT_IMAGE_3D:						return TYPE_UINT_IMAGE_3D;

		case GL_UNSIGNED_INT_ATOMIC_COUNTER:				return TYPE_UINT_ATOMIC_COUNTER;

		case GL_SAMPLER_BUFFER:								return TYPE_SAMPLER_BUFFER;
		case GL_INT_SAMPLER_BUFFER:							return TYPE_INT_SAMPLER_BUFFER;
		case GL_UNSIGNED_INT_SAMPLER_BUFFER:				return TYPE_UINT_SAMPLER_BUFFER;

		case GL_SAMPLER_2D_MULTISAMPLE_ARRAY:				return TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY;
		case GL_INT_SAMPLER_2D_MULTISAMPLE_ARRAY:			return TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY;
		case GL_UNSIGNED_INT_SAMPLER_2D_MULTISAMPLE_ARRAY:	return TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY;

		case GL_IMAGE_BUFFER:								return TYPE_IMAGE_BUFFER;
		case GL_INT_IMAGE_BUFFER:							return TYPE_INT_IMAGE_BUFFER;
		case GL_UNSIGNED_INT_IMAGE_BUFFER:					return TYPE_UINT_IMAGE_BUFFER;

		default:
			return TYPE_LAST;
	}
}